

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

bool_t xdr_union(XDR *__xdrs,enum_t *__dscmp,char *__unp,xdr_discrim *__choices,xdrproc_t __dfault)

{
  byte bVar1;
  uint uVar2;
  bool_t bVar3;
  ulong uVar4;
  enum_t dscm;
  xdrproc_t dfault_local;
  xdr_discrim *choices_local;
  void *unp_local;
  enum_t *dscmp_local;
  XDR *xdrs_local;
  
  uVar2 = xdr_enum(__xdrs,__dscmp);
  uVar4 = (ulong)uVar2;
  if ((uVar2 & 1) == 0) {
    xdrs_local._7_1_ = false;
  }
  else {
    for (dfault_local = (xdrproc_t)__choices; *(long *)(dfault_local + 8) != 0;
        dfault_local = dfault_local + 0x10) {
      if (*(int *)dfault_local == *__dscmp) {
        uVar4 = (**(code **)(dfault_local + 8))(__xdrs,__unp);
        uVar4 = uVar4 & 0xffffffffffffff01;
        xdrs_local._7_1_ = SUB81(uVar4,0);
        goto LAB_00118d91;
      }
    }
    if (__dfault == (xdrproc_t)0x0) {
      bVar1 = 0;
    }
    else {
      bVar3 = (*__dfault)(__xdrs,__unp);
      bVar1 = (byte)bVar3 & 1;
    }
    xdrs_local._7_1_ = bVar1 != 0;
    uVar4 = 0;
  }
LAB_00118d91:
  return (bool_t)CONCAT71((int7)(uVar4 >> 8),xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_union(XDR *xdrs,
	  enum_t *dscmp,	/* enum to decide which arm to work on */
	  void *unp,		/* the union itself */
	  const struct xdr_discrim *choices,
				/* [value, xdr proc] for each arm */
	  xdrproc_t dfault /* default xdr routine */)
{
	enum_t dscm;

	/*
	 * we deal with the discriminator;  it's an enum
	 */
	if (!inline_xdr_enum(xdrs, dscmp))
		return (false);
	dscm = *dscmp;

	/*
	 * search choices for a value that matches the discriminator.
	 * if we find one, execute the xdr routine for that value.
	 */
	for (; choices->proc != NULL_xdrproc_t; choices++) {
		if (choices->value == dscm)
			return ((*(choices->proc)) (xdrs, unp));
	}

	/*
	 * no match - execute the default xdr routine if there is one
	 */
	return ((dfault == NULL_xdrproc_t) ? false : (*dfault) (xdrs, unp));
}